

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

ERROR_HANDLE error_clone(ERROR_HANDLE value)

{
  AMQP_VALUE pAVar1;
  ERROR_HANDLE local_18;
  ERROR_INSTANCE *error_instance;
  ERROR_HANDLE value_local;
  
  local_18 = (ERROR_HANDLE)malloc(8);
  if (local_18 != (ERROR_HANDLE)0x0) {
    pAVar1 = amqpvalue_clone(value->composite_value);
    local_18->composite_value = pAVar1;
    if (local_18->composite_value == (AMQP_VALUE)0x0) {
      free(local_18);
      local_18 = (ERROR_HANDLE)0x0;
    }
  }
  return local_18;
}

Assistant:

ERROR_HANDLE error_clone(ERROR_HANDLE value)
{
    ERROR_INSTANCE* error_instance = (ERROR_INSTANCE*)malloc(sizeof(ERROR_INSTANCE));
    if (error_instance != NULL)
    {
        error_instance->composite_value = amqpvalue_clone(((ERROR_INSTANCE*)value)->composite_value);
        if (error_instance->composite_value == NULL)
        {
            free(error_instance);
            error_instance = NULL;
        }
    }

    return error_instance;
}